

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

StringPtr __thiscall kj::HttpHeaders::cloneToOwn(HttpHeaders *this,StringPtr str)

{
  Array<char> *pAVar1;
  Array<char> *pAVar2;
  RemoveConst<kj::Array<char>_> *pRVar3;
  char *pcVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  char *pcVar7;
  size_t sVar8;
  StringPtr SVar9;
  String copy;
  char *pcVar10;
  size_t sVar11;
  String local_38;
  
  heapString(&local_38,str.content.ptr,str.content.size_ - 1);
  pAVar6 = local_38.content.disposer;
  sVar5 = local_38.content.size_;
  pcVar7 = local_38.content.ptr;
  local_38.content.ptr = (char *)0x0;
  local_38.content.size_ = 0;
  pAVar1 = (this->ownedStrings).builder.endPtr;
  pcVar10 = pcVar7;
  sVar11 = sVar5;
  if ((this->ownedStrings).builder.pos == pAVar1) {
    pAVar2 = (this->ownedStrings).builder.ptr;
    sVar8 = 4;
    if (pAVar1 != pAVar2) {
      sVar8 = ((long)pAVar1 - (long)pAVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,sVar8);
  }
  sVar8 = local_38.content.size_;
  pcVar4 = local_38.content.ptr;
  pRVar3 = (this->ownedStrings).builder.pos;
  pRVar3->ptr = pcVar10;
  pRVar3->size_ = sVar11;
  pRVar3->disposer = pAVar6;
  (this->ownedStrings).builder.pos = pRVar3 + 1;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar4,1,sVar8,sVar8,0,0,0);
  }
  SVar9.content.size_ = sVar5 + (sVar5 == 0);
  if (sVar5 == 0) {
    pcVar7 = "";
  }
  SVar9.content.ptr = pcVar7;
  return (StringPtr)SVar9.content;
}

Assistant:

kj::StringPtr HttpHeaders::cloneToOwn(kj::StringPtr str) {
  auto copy = kj::heapString(str);
  kj::StringPtr result = copy;
  ownedStrings.add(copy.releaseArray());
  return result;
}